

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O1

ConstTestNodeIterator *
xe::ConstTestNodeIterator::begin(ConstTestNodeIterator *__return_storage_ptr__,TestNode *root)

{
  pointer *ppGVar1;
  iterator __position;
  GroupState local_28;
  
  __return_storage_ptr__->m_root = root;
  (__return_storage_ptr__->m_iterStack).
  super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_iterStack).
  super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_iterStack).
  super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28.group = (TestGroup *)0x0;
  local_28.childNdx = 0;
  __position._M_current =
       (__return_storage_ptr__->m_iterStack).
       super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->m_iterStack).
      super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
    ::_M_realloc_insert<xe::ConstTestNodeIterator::GroupState>
              (&__return_storage_ptr__->m_iterStack,__position,&local_28);
  }
  else {
    (__position._M_current)->group = (TestGroup *)0x0;
    *(ulong *)&(__position._M_current)->childNdx = (ulong)(uint)local_28._12_4_ << 0x20;
    ppGVar1 = &(__return_storage_ptr__->m_iterStack).
               super__Vector_base<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTestNodeIterator ConstTestNodeIterator::begin (const TestNode* root)
{
	ConstTestNodeIterator iter(root);
	iter.m_iterStack.push_back(GroupState(DE_NULL));
	return iter;
}